

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O0

CURLcode addexpect(Curl_easy *data,dynbuf *r,_Bool *announced_exp100)

{
  _Bool _Var1;
  CURLcode CVar2;
  char *headerline;
  curl_off_t cVar3;
  curl_off_t client_len;
  char *ptr;
  CURLcode result;
  _Bool *announced_exp100_local;
  dynbuf *r_local;
  Curl_easy *data_local;
  
  *announced_exp100 = false;
  if ((data->req).upgr101 == UPGR101_INIT) {
    headerline = Curl_checkheaders(data,"Expect",6);
    if (headerline == (char *)0x0) {
      if (((((*(uint *)&(data->state).field_0x774 >> 7 & 1) == 0) &&
           (_Var1 = Curl_use_http_1_1plus(data,data->conn), _Var1)) &&
          (data->conn->httpversion < 0x14)) &&
         ((cVar3 = Curl_creader_client_length(data), 0x100000 < cVar3 || (cVar3 < 0)))) {
        CVar2 = Curl_dyn_addn(r,"Expect: 100-continue\r\n",0x16);
        if (CVar2 != CURLE_OK) {
          return CVar2;
        }
        *announced_exp100 = true;
      }
    }
    else {
      _Var1 = Curl_compareheader(headerline,"Expect:",7,"100-continue",0xc);
      *announced_exp100 = _Var1;
    }
  }
  return CURLE_OK;
}

Assistant:

static CURLcode addexpect(struct Curl_easy *data, struct dynbuf *r,
                          bool *announced_exp100)
{
  CURLcode result;
  char *ptr;

  *announced_exp100 = FALSE;
  /* Avoid Expect: 100-continue if Upgrade: is used */
  if(data->req.upgr101 != UPGR101_INIT)
    return CURLE_OK;

  /* For really small puts we do not use Expect: headers at all, and for
     the somewhat bigger ones we allow the app to disable it. Just make
     sure that the expect100header is always set to the preferred value
     here. */
  ptr = Curl_checkheaders(data, STRCONST("Expect"));
  if(ptr) {
    *announced_exp100 =
      Curl_compareheader(ptr, STRCONST("Expect:"), STRCONST("100-continue"));
  }
  else if(!data->state.disableexpect &&
          Curl_use_http_1_1plus(data, data->conn) &&
          (data->conn->httpversion < 20)) {
    /* if not doing HTTP 1.0 or version 2, or disabled explicitly, we add an
       Expect: 100-continue to the headers which actually speeds up post
       operations (as there is one packet coming back from the web server) */
    curl_off_t client_len = Curl_creader_client_length(data);
    if(client_len > EXPECT_100_THRESHOLD || client_len < 0) {
      result = Curl_dyn_addn(r, STRCONST("Expect: 100-continue\r\n"));
      if(result)
        return result;
      *announced_exp100 = TRUE;
    }
  }
  return CURLE_OK;
}